

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogicalOperandsTests.cpp
# Opt level: O3

void __thiscall NotOperandTests::Run(NotOperandTests *this)

{
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"NotOperand is an Operand","");
  local_58 = 0;
  uStack_50 = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/detail/LogicalOperandsTests.cpp:199:36)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/detail/LogicalOperandsTests.cpp:199:36)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_38);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  GivenOperandWhenResultOfOperandIsXThenResultIsZ(this,true,false);
  GivenOperandWhenResultOfOperandIsXThenResultIsZ(this,false,true);
  return;
}

Assistant:

virtual void Run()
	{
		Then("NotOperand is an Operand", [&]()
		{
			AssertThat(ut11::detail::IsOperand < ut11::detail::NotOperand < MockOperand<int> >> ::value, ut11::Is::True);
		});

		GivenOperandWhenResultOfOperandIsXThenResultIsZ(true, false);
		GivenOperandWhenResultOfOperandIsXThenResultIsZ(false, true);
	}